

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsscanf.c
# Opt level: O0

int vsscanf(char *__s,char *__format,__gnuc_va_list __arg)

{
  int iVar1;
  __va_list_tag *p_Var2;
  char *rc;
  _PDCLIB_status_t status;
  __va_list_tag *arg_local;
  char *format_local;
  char *s_local;
  
  rc._0_4_ = 0;
  rc._4_4_ = 0;
  status.base = 0;
  status.flags = 0;
  status.n = 0;
  status.i = 0;
  status.s = (char *)0x0;
  status.width._0_4_ = 0xffffffff;
  status.prec = 0;
  status._52_4_ = 0;
  status.arg[0].overflow_arg_area = *(void **)((long)__arg + 0x10);
  status.stream = *__arg;
  status.arg[0]._0_8_ = *(undefined8 *)((long)__arg + 8);
  status.current = (unsigned_long)__s;
  status.arg[0].reg_save_area = __arg;
  arg_local = (__va_list_tag *)__format;
  do {
    while( true ) {
      if ((char)arg_local->gp_offset == '\0') goto LAB_0010995d;
      if (((char)arg_local->gp_offset == '%') &&
         (p_Var2 = (__va_list_tag *)_PDCLIB_scan((char *)arg_local,(_PDCLIB_status_t *)&rc),
         p_Var2 != arg_local)) break;
      iVar1 = isspace((uint)(byte)arg_local->gp_offset);
      if (iVar1 == 0) {
        if (*(char *)status.current != (char)arg_local->gp_offset) {
          if ((*(char *)status.current == '\0') && (status._0_8_ == 0)) {
            return -1;
          }
          return status.base;
        }
        status.current = status.current + 1;
        status.n = status.n + 1;
      }
      else {
        while (iVar1 = isspace((uint)*(byte *)status.current), iVar1 != 0) {
          status.current = status.current + 1;
          status.n = status.n + 1;
        }
      }
      arg_local = (__va_list_tag *)((long)&arg_local->gp_offset + 1);
    }
    arg_local = p_Var2;
  } while (p_Var2 != (__va_list_tag *)0x0);
  if ((*(char *)status.current == '\n') && (status._0_8_ == 0)) {
    status.base = -1;
    status.flags = -1;
  }
LAB_0010995d:
  return status.base;
}

Assistant:

int vsscanf( const char * _PDCLIB_restrict s, const char * _PDCLIB_restrict format, va_list arg )
{
    /* TODO: This function should interpret format as multibyte characters.  */
    struct _PDCLIB_status_t status;
    status.base = 0;
    status.flags = 0;
    status.n = 0;
    status.i = 0;
    status.current = 0;
    status.s = ( char * ) s;
    status.width = 0;
    status.prec = EOF;
    status.stream = NULL;
    va_copy( status.arg, arg );

    while ( *format != '\0' )
    {
        const char * rc;

        if ( ( *format != '%' ) || ( ( rc = _PDCLIB_scan( format, &status ) ) == format ) )
        {
            /* No conversion specifier, match verbatim */
            if ( isspace( (unsigned char)*format ) )
            {
                /* Whitespace char in format string: Skip all whitespaces */
                /* No whitespaces in input do not result in matching error */
                while ( isspace( (unsigned char)*status.s ) )
                {
                    ++status.s;
                    ++status.i;
                }
            }
            else
            {
                /* Non-whitespace char in format string: Match verbatim */
                if ( *status.s != *format )
                {
                    if ( *status.s == '\0' && status.n == 0 )
                    {
                        /* Early input error */
                        return EOF;
                    }

                    /* Matching error */
                    return status.n;
                }
                else
                {
                    ++status.s;
                    ++status.i;
                }
            }

            ++format;
        }
        else
        {
            /* NULL return code indicates error */
            if ( rc == NULL )
            {
                if ( ( *status.s == '\n' ) && ( status.n == 0 ) )
                {
                    status.n = EOF;
                }

                break;
            }

            /* Continue parsing after conversion specifier */
            format = rc;
        }
    }

    va_end( status.arg );
    return status.n;
}